

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Token.cpp
# Opt level: O3

void __thiscall
slang::parsing::Token::Token
          (Token *this,BumpAllocator *alloc,TokenKind kind,
          span<const_slang::parsing::Trivia,_18446744073709551615UL> trivia,string_view rawText,
          SourceLocation location,SVInt *value)

{
  byte *pbVar1;
  bool bVar2;
  bool bVar3;
  bool bVar4;
  uint uVar5;
  SVInt *pSVar6;
  Info *pIVar7;
  uint uVar8;
  uint uVar9;
  ulong size;
  anon_union_8_2_628a4eb3_for_SVIntStorage_0 __dest;
  
  (this->numFlags).raw = '\0';
  this->rawLen = 0;
  this->info = (Info *)0x0;
  init(this,(EVP_PKEY_CTX *)alloc);
  uVar5 = (value->super_SVIntStorage).bitWidth;
  bVar2 = (value->super_SVIntStorage).signFlag;
  bVar3 = (value->super_SVIntStorage).unknownFlag;
  if (uVar5 < 0x41 && (bVar3 & 1U) == 0) {
    __dest = (value->super_SVIntStorage).field_0;
  }
  else {
    uVar9 = uVar5 + 0x3f >> 6;
    size = (ulong)((uVar9 << (bVar3 & 0x1fU)) << 3);
    __dest.val = (ulong)(alloc->head->current + 7) & 0xfffffffffffffff8;
    pbVar1 = (byte *)(__dest.val + size);
    if (alloc->endPtr < pbVar1) {
      __dest.pVal = (uint64_t *)BumpAllocator::allocateSlow(alloc,size,8);
      uVar8 = (value->super_SVIntStorage).bitWidth;
      uVar9 = uVar8 + 0x3f >> 6;
    }
    else {
      alloc->head->current = pbVar1;
      uVar8 = uVar5;
    }
    bVar4 = (value->super_SVIntStorage).unknownFlag;
    pSVar6 = (SVInt *)(value->super_SVIntStorage).field_0.pVal;
    if ((bVar4 & 1U) != 0) {
      value = pSVar6;
    }
    if (0x40 < uVar8) {
      value = pSVar6;
    }
    memcpy(__dest.pVal,value,(ulong)((uVar9 << (bVar4 & 0x1fU)) << 3));
  }
  pIVar7 = this->info;
  pIVar7[1].rawTextPtr = (char *)__dest;
  *(uint *)&pIVar7[1].location = uVar5;
  pIVar7[1].location.field_0x4 = bVar2;
  pIVar7[1].location.field_0x5 = bVar3;
  return;
}

Assistant:

Token::Token(BumpAllocator& alloc, TokenKind kind, std::span<Trivia const> trivia,
             std::string_view rawText, SourceLocation location, const SVInt& value) {
    SLANG_ASSERT(kind == TokenKind::IntegerLiteral);
    init(alloc, kind, trivia, rawText, location);

    SVIntStorage storage(value.getBitWidth(), value.isSigned(), value.hasUnknown());
    if (value.isSingleWord())
        storage.val = *value.getRawPtr();
    else {
        storage.pVal = (uint64_t*)alloc.allocate(sizeof(uint64_t) * value.getNumWords(),
                                                 alignof(uint64_t));
        memcpy(storage.pVal, value.getRawPtr(), sizeof(uint64_t) * value.getNumWords());
    }

    info->integer() = storage;
}